

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeStorage(ImGuiStorage *storage,char *label)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ImGuiStoragePair *pIVar4;
  ImGuiStoragePair *p;
  ImGuiStoragePair *pIVar5;
  
  uVar1 = (storage->Data).Size;
  bVar2 = TreeNode(label,"%s: %d entries, %d bytes",label,(ulong)uVar1,(ulong)(uVar1 << 4));
  if (bVar2) {
    lVar3 = (long)(storage->Data).Size;
    if (lVar3 != 0) {
      pIVar5 = (storage->Data).Data;
      pIVar4 = pIVar5 + lVar3;
      do {
        BulletText("Key 0x%08X Value { i: %d }",(ulong)pIVar5->key,
                   (ulong)(uint)(pIVar5->field_1).val_i);
        DebugLocateItemOnHover(pIVar5->key);
        pIVar5 = pIVar5 + 1;
      } while (pIVar5 != pIVar4);
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeStorage(ImGuiStorage* storage, const char* label)
{
    if (!TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
        return;
    for (const ImGuiStoragePair& p : storage->Data)
    {
        BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
        DebugLocateItemOnHover(p.key);
    }
    TreePop();
}